

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

positional_options_description * __thiscall
program_options::positional_options_description::add
          (positional_options_description *this,char *name,int max_count)

{
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  allocator<char> local_49;
  value_type local_48;
  
  if (max_count == -1) {
    pcVar3 = (char *)(this->m_trailing)._M_string_length;
    strlen(name);
    std::__cxx11::string::_M_replace((ulong)&this->m_trailing,0,pcVar3,(ulong)name);
  }
  else {
    pbVar1 = (this->m_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = (this->m_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->m_names,(long)max_count + ((long)pbVar1 - (long)pbVar2 >> 5),&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return this;
}

Assistant:

positional_options_description& positional_options_description::add(const char* name, int max_count) {
    assert(max_count != -1 || m_trailing.empty());
    if (max_count == -1)
        m_trailing = name;
    else {
        m_names.resize(m_names.size() + max_count, name);
    }
    return *this;
}